

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void statement(LexState *ls)

{
  unsigned_short *puVar1;
  byte bVar2;
  byte bVar3;
  FuncState *pFVar4;
  LocVar *pLVar5;
  LexState *pLVar6;
  ravi_type_map rVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  TString *pTVar13;
  TString *pTVar14;
  long lVar15;
  Labeldesc *pLVar16;
  ushort uVar17;
  expkind eVar18;
  int iVar19;
  char *pcVar20;
  expdesc *info;
  FuncState *pFVar21;
  uint uVar22;
  FuncState *fs_1;
  TString **pusertype;
  Labellist *l;
  ulong uVar23;
  FuncState *fs;
  expdesc e;
  Fornuminfo tlimit;
  Fornuminfo tidx;
  BlockCnt bl;
  int local_734;
  expdesc local_728;
  Fornuminfo local_6e8 [6];
  undefined1 local_698 [8];
  undefined1 auStack_690 [24];
  ravi_type_map rStack_678;
  ravi_type_map rStack_674;
  ravi_type_map rStack_670;
  undefined4 uStack_66c;
  int iStack_668;
  undefined4 uStack_664;
  undefined1 local_258 [24];
  undefined8 uStack_240;
  ravi_type_map rStack_238;
  undefined1 auStack_234 [12];
  int iStack_228;
  undefined4 uStack_224;
  
  iVar10 = ls->linenumber;
  pFVar21 = ls->fs;
  uVar17 = ls->L->nCcalls + 1;
  ls->L->nCcalls = uVar17;
  if (0x7d < uVar17) {
    errorlimit(pFVar21,0x7d,"C levels");
  }
  iVar9 = (ls->t).token;
  switch(iVar9) {
  case 0x102:
  case 0x10a:
    iVar10 = luaK_jump(pFVar21);
    gotostat(ls,iVar10);
    break;
  case 0x103:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x106,0x103,iVar10);
    break;
  case 0x108:
    iVar8 = 1;
    enterblock(pFVar21,(BlockCnt *)local_258,'\x01');
    luaX_next(ls);
    pTVar14 = str_checkname(ls);
    iVar9 = (ls->t).token;
    if ((iVar9 == 0x2c) || (iVar9 == 0x10c)) {
      pFVar4 = ls->fs;
      rStack_674 = 0;
      rStack_670 = 0;
      uStack_66c = 0;
      uStack_664 = 0;
      local_698._0_4_ = VVOID;
      local_698._4_4_ = 0;
      auStack_690._0_4_ = VVOID;
      auStack_690._4_4_ = 0;
      auStack_690._8_4_ = 0;
      auStack_690._12_4_ = 0;
      auStack_690._16_4_ = 0;
      auStack_690._20_4_ = 0;
      rStack_678 = 0xffffffff;
      iStack_668 = -1;
      bVar3 = pFVar4->freereg;
      pTVar13 = luaX_newstring(ls,"(for generator)",0xf);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      pTVar13 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      pTVar13 = luaX_newstring(ls,"(for control)",0xd);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      new_localvar(ls,pTVar14,0xffffffff,(TString *)0x0);
      if ((ls->t).token == 0x2c) {
        iVar8 = 1;
        do {
          luaX_next(ls);
          pTVar14 = str_checkname(ls);
          new_localvar(ls,pTVar14,0xffffffff,(TString *)0x0);
          iVar8 = iVar8 + 1;
        } while ((ls->t).token == 0x2c);
      }
      checknext(ls,0x10c);
      iVar9 = ls->linenumber;
      iVar19 = explist(ls,(expdesc *)local_698);
      adjust_assign(ls,3,iVar19,(expdesc *)local_698);
      luaK_checkstack(pFVar4,3);
      iVar19 = 0;
      info = (expdesc *)0x0;
    }
    else {
      if (iVar9 != 0x3d) {
        pcVar20 = "\'=\' or \'in\' expected";
        goto LAB_00120fb1;
      }
      pFVar4 = ls->fs;
      bVar3 = pFVar4->freereg;
      pTVar13 = luaX_newstring(ls,"(for index)",0xb);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      pTVar13 = luaX_newstring(ls,"(for limit)",0xb);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      pTVar13 = luaX_newstring(ls,"(for step)",10);
      new_localvar(ls,pTVar13,0xffffffff,(TString *)0x0);
      new_localvar(ls,pTVar14,0xffffffff,(TString *)0x0);
      lVar15 = (long)pFVar4->nlocvars;
      checknext(ls,0x3d);
      local_728.u.info = 0;
      local_728.k = VLOCAL;
      local_728._4_4_ = 0;
      auStack_690._0_4_ = VVOID;
      local_698._0_4_ = ~VVOID;
      local_698._4_4_ = 0;
      local_6e8[0].int_value = 0;
      local_6e8[0].type_map = 0xffffffff;
      local_6e8[0].is_constant = 0;
      exp1(ls,(Fornuminfo *)local_698);
      checknext(ls,0x2c);
      exp1(ls,local_6e8);
      if ((ls->t).token == 0x2c) {
        luaX_next(ls);
        exp1(ls,(Fornuminfo *)&local_728);
        eVar18 = local_728.k;
      }
      else {
        local_728._4_4_ = 1;
        local_728.u.info = 1;
        bVar2 = pFVar4->freereg;
        iVar9 = luaK_intK(pFVar4,1);
        luaK_codek(pFVar4,(uint)bVar2,iVar9);
        luaK_reserveregs(pFVar4,1);
        eVar18 = VLOCAL;
      }
      info = (expdesc *)0x0;
      if ((local_698._0_4_ == local_6e8[0].type_map) && (local_6e8[0].type_map == eVar18)) {
        if ((local_698._0_4_ == 0x10) || (local_698._0_4_ == VLOCAL)) {
          pLVar5 = pFVar4->f->locvars;
          info = &local_728;
          if (local_728._4_4_ == 0) {
            info = (expdesc *)0x0;
          }
          if (local_698._0_4_ != VLOCAL) {
            info = (expdesc *)0x0;
          }
          pLVar5[lVar15 + -1].ravi_type_map = local_698._0_4_;
          pLVar5[lVar15 + -2].ravi_type_map = local_698._0_4_;
          pLVar5[lVar15 + -3].ravi_type_map = local_698._0_4_;
          pLVar5[lVar15 + -4].ravi_type_map = local_698._0_4_;
          if ((((((byte)ravi_parser_debug & 4) != 0) &&
               (raviY_printf(pFVar4,"fornum -> setting type for index %v\n",pLVar5 + lVar15 + -4),
               ((byte)ravi_parser_debug & 4) != 0)) &&
              (raviY_printf(pFVar4,"fornum -> setting type for limit %v\n",pLVar5 + lVar15 + -3),
              ((byte)ravi_parser_debug & 4) != 0)) &&
             (raviY_printf(pFVar4,"fornum -> setting type for step %v\n",pLVar5 + lVar15 + -2),
             ((byte)ravi_parser_debug & 4) != 0)) {
            raviY_printf(pFVar4,"fornum -> setting type for variable %v\n",pLVar5 + lVar15 + -1);
          }
        }
        else {
          info = (expdesc *)0x0;
        }
      }
      iVar8 = 1;
      iVar19 = 1;
      iVar9 = iVar10;
    }
    forbody(ls,(uint)bVar3,iVar9,iVar8,iVar19,(Fornuminfo *)info);
    check_match(ls,0x106,0x108,iVar10);
    goto LAB_00121413;
  case 0x109:
    auStack_690._4_4_ = 0;
    rStack_670 = 0;
    uStack_66c = 0;
    uStack_664 = 0;
    local_698._0_4_ = VVOID;
    local_698._4_4_ = 0;
    auStack_690._0_4_ = VVOID;
    auStack_690._8_4_ = 0;
    auStack_690._12_4_ = 0;
    auStack_690._16_4_ = 0;
    auStack_690._20_4_ = 0;
    rStack_678 = 0xffffffff;
    auStack_234 = ZEXT412(0);
    uStack_224 = 0;
    local_258._4_12_ = SUB1612(ZEXT816(0) << 0x40,4);
    local_258[0x10] = 0;
    local_258[0x11] = '\0';
    local_258[0x12] = '\0';
    local_258[0x13] = '\0';
    local_258._20_4_ = 0;
    uStack_240._0_4_ = 0;
    uStack_240._4_4_ = 0;
    rStack_238 = 0xffffffff;
    iStack_668 = -1;
    iStack_228 = -1;
    rStack_674 = auStack_690._4_4_;
    local_258._0_4_ = local_698._0_4_;
    luaX_next(ls);
    singlevar(ls,(expdesc *)local_698);
    while (iVar9 = (ls->t).token, iVar9 == 0x2e) {
      fieldsel(ls,(expdesc *)local_698);
    }
    if (iVar9 == 0x3a) {
      fieldsel(ls,(expdesc *)local_698);
    }
    if (((byte)ravi_parser_debug & 4) != 0) {
      raviY_printf(ls->fs,"funcstat -> declaring function %e\n",local_698);
    }
    body(ls,(expdesc *)local_258,(uint)(iVar9 == 0x3a),iVar10,0);
    luaK_storevar(ls->fs,(expdesc *)local_698,(expdesc *)local_258);
    luaK_fixline(ls->fs,iVar10);
    break;
  case 0x10b:
    local_6e8[0].type_map = 0xffffffff;
    do {
      pFVar4 = ls->fs;
      auStack_690._4_4_ = 0;
      rStack_670 = 0;
      uStack_66c = 0;
      uStack_664 = 0;
      local_698._0_4_ = VVOID;
      local_698._4_4_ = 0;
      auStack_690._0_4_ = VVOID;
      auStack_690._8_4_ = 0;
      auStack_690._12_4_ = 0;
      auStack_690._16_4_ = 0;
      auStack_690._20_4_ = 0;
      rStack_678 = 0xffffffff;
      iStack_668 = -1;
      rStack_674 = auStack_690._4_4_;
      luaX_next(ls);
      subexpr(ls,(expdesc *)local_698,0);
      checknext(ls,0x114);
      if (((ls->t).token | 8U) == 0x10a) {
        luaK_goiffalse(ls->fs,(expdesc *)local_698);
        enterblock(pFVar4,(BlockCnt *)local_258,'\0');
        gotostat(ls,auStack_690._16_4_);
        while (iVar9 = (ls->t).token, iVar9 == 0x3b) {
          luaX_next(ls);
        }
        uVar22 = iVar9 - 0x104;
        if ((0x1e < uVar22) || ((0x40000007U >> (uVar22 & 0x1f) & 1) == 0)) {
          iVar9 = luaK_jump(pFVar4);
          goto LAB_00120a1d;
        }
        leaveblock(pFVar4);
      }
      else {
        luaK_goiftrue(ls->fs,(expdesc *)local_698);
        enterblock(pFVar4,(BlockCnt *)local_258,'\0');
        iVar9 = auStack_690._20_4_;
LAB_00120a1d:
        statlist(ls);
        leaveblock(pFVar4);
        if (((ls->t).token & 0xfffffffeU) == 0x104) {
          iVar8 = luaK_jump(pFVar4);
          luaK_concat(pFVar4,(int *)local_6e8,iVar8);
        }
        luaK_patchtohere(pFVar4,iVar9);
      }
      iVar9 = (ls->t).token;
    } while (iVar9 == 0x105);
    if (iVar9 == 0x104) {
      luaX_next(ls);
      block(ls);
    }
    check_match(ls,0x106,0x10b,iVar10);
    rVar7 = local_6e8[0].type_map;
    goto LAB_00120bb4;
  case 0x10d:
    luaX_next(ls);
    if ((ls->t).token != 0x109) {
      lVar15 = 0;
      local_728.usertype = (TString *)0x0;
      local_728.k = VVOID;
      local_728._4_4_ = 0;
      local_728.u.info = 0;
      local_728.u.ind.key_ravi_type_map = 0;
      local_728.u.ind.usertype = (TString *)0x0;
      local_728.t = 0;
      local_728.f = 0;
      local_728.ravi_type_map = 0xffffffff;
      local_728._36_4_ = 0;
      local_728.pc = -1;
      local_728._52_4_ = 0;
      memset(local_258,0,0x21c);
      memset(local_698,0,0x438);
      local_258._0_4_ = declare_localvar(ls,(TString **)local_698);
      pusertype = (TString **)auStack_690;
      do {
        iVar10 = (ls->t).token;
        if (iVar10 != 0x2c) {
          iVar9 = (int)(lVar15 + 1U);
          if (iVar10 == 0x3d) {
            luaX_next(ls);
            local_734 = localvar_explist(ls,&local_728,(ravi_type_map *)local_258,
                                         (TString **)local_698,iVar9);
            pFVar21 = ls->fs;
            uVar23 = (ulong)(uint)-local_734 + 1 + lVar15;
            iVar10 = (int)uVar23;
            if (local_728.k - VCALL < 2) {
              iVar8 = -1;
              if (-1 < iVar10) {
                iVar8 = iVar10;
              }
              luaK_setreturns(pFVar21,&local_728,iVar8 + 1);
              uVar22 = iVar8 + 1;
              if ((uVar22 != 0) && (local_728.k == VCALL)) {
                uVar12 = ls->fs->f->code[local_728.u.info];
                if ((char)uVar12 != '$') {
                  __assert_fail("((OpCode)(((*pc)&0xff))) == OP_CALL",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                                ,0x2a8,"void ravi_coercetype(LexState *, expdesc *, int)");
                }
                if (1 < uVar22) {
                  uVar12 = uVar12 >> 8 & 0x7f;
                  iVar19 = uVar12 + 1;
                  do {
                    iVar11 = register_to_locvar_index(ls->fs,iVar19);
                    pLVar5 = ls->fs->f->locvars;
                    ravi_code_typecoersion
                              (ls,iVar19,pLVar5[iVar11].ravi_type_map,pLVar5[iVar11].usertype);
                    iVar19 = iVar19 + 1;
                  } while (iVar19 < (int)(uVar22 + uVar12));
                }
              }
              if (0 < iVar10) {
                luaK_reserveregs(pFVar21,iVar8);
              }
            }
            else {
              if (local_728.k != VVOID) {
                luaK_exp2nextreg(pFVar21,&local_728);
              }
              if (0 < iVar10) goto LAB_00121323;
            }
          }
          else {
            local_728.k = VVOID;
            local_734 = 0;
            uVar23 = lVar15 + 1U & 0xffffffff;
            pFVar21 = ls->fs;
LAB_00121323:
            bVar3 = pFVar21->freereg;
            uVar22 = (uint)bVar3;
            iVar10 = (int)uVar23;
            luaK_reserveregs(pFVar21,iVar10);
            luaK_nil(pFVar21,(uint)bVar3,iVar10);
            do {
              iVar8 = register_to_locvar_index(pFVar21,uVar22);
              uVar12 = pFVar21->f->locvars[iVar8].ravi_type_map;
              if ((uVar12 == 0x10) || (uVar12 == 8)) {
                luaK_codeABC(pFVar21,(uVar12 == 0x10) + OP_RAVI_LOADIZ,uVar22,0,0);
              }
              else if ((uVar12 & 1) == 0) {
                raviY_typemap_string(uVar12,(char *)local_6e8);
                pLVar6 = pFVar21->ls;
                pcVar20 = luaO_pushfstring(pLVar6->L,"uninitialized %s in local variable",local_6e8)
                ;
                luaX_syntaxerror(pLVar6,pcVar20);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 < iVar10 + (uint)bVar3);
          }
          pLVar6 = (LexState *)ls->fs;
          if (iVar9 < local_734) {
            pcVar20 = (char *)((long)&pLVar6->L + 4);
            *pcVar20 = *pcVar20 + (char)uVar23;
          }
          adjustlocalvars(pLVar6,iVar9);
          goto LAB_0012141b;
        }
        luaX_next(ls);
        rVar7 = declare_localvar(ls,pusertype);
        *(ravi_type_map *)(local_258 + lVar15 * 4 + 4) = rVar7;
        lVar15 = lVar15 + 1;
        pusertype = pusertype + 1;
      } while (lVar15 != 0x86);
      pcVar20 = "too many local variables";
      goto LAB_00120fb1;
    }
    luaX_next(ls);
    iVar10 = 0;
    goto LAB_00120c78;
  case 0x10e:
    luaX_next(ls);
    iVar10 = 1;
LAB_00120c78:
    localfunc(ls,iVar10);
    break;
  case 0x112:
    iVar9 = luaK_getlabel(pFVar21);
    enterblock(pFVar21,(BlockCnt *)local_698,'\x01');
    enterblock(pFVar21,(BlockCnt *)local_258,'\0');
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x116,0x112,iVar10);
    iVar10 = cond(ls);
    if (local_258[0x11] != '\0') {
      luaK_patchclose(pFVar21,iVar10,(uint)(byte)local_258[0x10]);
    }
    leaveblock(pFVar21);
    luaK_patchlist(pFVar21,iVar10,iVar9);
LAB_00121413:
    leaveblock(pFVar21);
    break;
  case 0x113:
    luaX_next(ls);
    pFVar21 = ls->fs;
    uVar12 = 0;
    rStack_674 = 0;
    rStack_670 = 0;
    uStack_66c = 0;
    uStack_664 = 0;
    local_698._0_4_ = VVOID;
    local_698._4_4_ = 0;
    auStack_690._0_4_ = VVOID;
    auStack_690._4_4_ = 0;
    auStack_690._8_4_ = 0;
    auStack_690._12_4_ = 0;
    auStack_690._16_4_ = 0;
    auStack_690._20_4_ = 0;
    rStack_678 = 0xffffffff;
    iStack_668 = -1;
    iVar10 = (ls->t).token;
    uVar22 = iVar10 - 0x104;
    if ((uVar22 < 0x1f) && ((0x40040007U >> (uVar22 & 0x1f) & 1) != 0)) {
      iVar9 = 0;
      uVar12 = 0;
    }
    else {
      iVar9 = 0;
      if (iVar10 != 0x3b) {
        iVar9 = explist(ls,(expdesc *)local_698);
        if (local_698._0_4_ - VCALL < 2) {
          luaK_setreturns(pFVar21,(expdesc *)local_698,-1);
          if (((iVar9 == 1 && local_698._0_4_ == VCALL) && (pFVar21->bl->insidetbc == '\0')) &&
             (*(undefined1 *)(pFVar21->f->code + (int)auStack_690._0_4_) = 0x25,
             (pFVar21->f->code[(int)auStack_690._0_4_] >> 8 & 0x7f) != (uint)pFVar21->nactvar)) {
            __assert_fail("((int)(((((fs)->f->code[(&e)->u.info]))>>8)&0x7f)) == fs->nactvar",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                          ,0x959,"void retstat(LexState *)");
          }
          uVar12 = (uint)pFVar21->nactvar;
          iVar9 = -1;
        }
        else if (iVar9 == 1) {
          uVar12 = luaK_exp2anyreg(pFVar21,(expdesc *)local_698);
          iVar9 = 1;
        }
        else {
          luaK_exp2nextreg(pFVar21,(expdesc *)local_698);
          uVar12 = (uint)pFVar21->nactvar;
          if (iVar9 != pFVar21->freereg - uVar12) {
            __assert_fail("nret == fs->freereg - first",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                          ,0x964,"void retstat(LexState *)");
          }
        }
      }
    }
    luaK_ret(pFVar21,uVar12,iVar9);
    if ((ls->t).token != 0x3b) break;
LAB_00120750:
    luaX_next(ls);
    break;
  case 0x117:
    luaX_next(ls);
    iVar9 = luaK_getlabel(pFVar21);
    rVar7 = cond(ls);
    enterblock(pFVar21,(BlockCnt *)local_698,'\x01');
    checknext(ls,0x103);
    block(ls);
    iVar8 = luaK_jump(pFVar21);
    luaK_patchlist(pFVar21,iVar8,iVar9);
    check_match(ls,0x106,0x117,iVar10);
    leaveblock(pFVar21);
LAB_00120bb4:
    luaK_patchtohere(pFVar21,rVar7);
    break;
  default:
    if (iVar9 == 0x121) {
      luaX_next(ls);
      pTVar14 = str_checkname(ls);
      pFVar21 = ls->fs;
      iVar9 = pFVar21->bl->firstlabel;
      iVar8 = (ls->dyd->label).n;
      l = &ls->dyd->label;
      if (iVar9 < iVar8) {
        lVar15 = (long)iVar8 - (long)iVar9;
        pLVar16 = l->arr + iVar9;
        do {
          if (pLVar16->name == pTVar14) {
            pcVar20 = luaO_pushfstring(pFVar21->ls->L,"label \'%s\' already defined on line %d",
                                       pTVar14 + 1,(ulong)(uint)pLVar16->line);
            semerror(pFVar21->ls,pcVar20);
          }
          pLVar16 = pLVar16 + 1;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      checknext(ls,0x121);
      iVar9 = luaK_getlabel(pFVar21);
      iVar10 = newlabelentry(ls,l,pTVar14,iVar10,iVar9);
      do {
        iVar9 = (ls->t).token;
        if (iVar9 < 0x121) {
          if (iVar9 != 0x3b) goto LAB_00120e73;
        }
        else if (iVar9 != 0x121) {
          if (iVar9 == 0x122) goto LAB_00120e81;
          goto LAB_001211c3;
        }
        statement(ls);
      } while( true );
    }
    if (iVar9 == 0x3b) goto LAB_00120750;
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x10c:
  case 0x10f:
  case 0x110:
  case 0x111:
  case 0x114:
  case 0x115:
  case 0x116:
    rStack_670 = 0xffffffff;
    suffixedexp(ls,(expdesc *)auStack_690);
    iVar10 = (ls->t).token;
    if ((iVar10 == 0x3d) || (iVar10 == 0x2c)) {
      local_698._0_4_ = VVOID;
      local_698._4_4_ = 0;
      assignment(ls,(LHS_assign *)local_698,1);
    }
    else {
      if (auStack_690._0_4_ != VCALL) {
        pcVar20 = "syntax error";
LAB_00120fb1:
        luaX_syntaxerror(ls,pcVar20);
      }
      *(undefined1 *)((long)pFVar21->f->code + (long)(int)auStack_690._8_4_ * 4 + 2) = 1;
    }
  }
LAB_0012141b:
  pFVar21 = ls->fs;
  if ((pFVar21->freereg <= pFVar21->f->maxstacksize) && (pFVar21->nactvar <= pFVar21->freereg)) {
    pFVar21->freereg = pFVar21->nactvar;
    puVar1 = &ls->L->nCcalls;
    *puVar1 = *puVar1 - 1;
    return;
  }
  __assert_fail("ls->fs->f->maxstacksize >= ls->fs->freereg && ls->fs->freereg >= ls->fs->nactvar",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x9b7,"void statement(LexState *)");
LAB_00120e73:
  if (iVar9 - 0x104U < 3) {
LAB_00120e81:
    pLVar16 = l->arr;
    pLVar16[iVar10].nactvar = pFVar21->bl->nactvar;
  }
  else {
LAB_001211c3:
    pLVar16 = l->arr;
  }
  findgotos(ls,pLVar16 + iVar10);
  goto LAB_0012141b;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
#ifdef RAVI_DEFER_STATEMENT
        localfunc(ls, 0);
#else
        localfunc(ls);
#endif
      else
        localstat(ls);
      break;
    }
#ifdef RAVI_DEFER_STATEMENT
    case TK_DEFER: {  /* stat -> deferstat */
      luaX_next(ls);  /* skip DEFER */
      localfunc(ls, 1);
      break;
    }
#endif
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK:   /* stat -> breakstat */
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      gotostat(ls, luaK_jump(ls->fs));
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= ls->fs->nactvar);
  ls->fs->freereg = ls->fs->nactvar;  /* free registers */
  leavelevel(ls);
}